

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::KtxTexture<ktxTexture>::~KtxTexture(KtxTexture<ktxTexture> *this)

{
  PFNKTEXDESTROY p_Var1;
  ktxTexture *pkVar2;
  KtxTexture<ktxTexture> *in_RDI;
  
  if (in_RDI->_handle != (ktxTexture *)0x0) {
    pkVar2 = handle<ktxTexture>(in_RDI);
    p_Var1 = pkVar2->vtbl->Destroy;
    pkVar2 = handle<ktxTexture>(in_RDI);
    (*p_Var1)(pkVar2);
    in_RDI->_handle = (ktxTexture *)0x0;
  }
  return;
}

Assistant:

~KtxTexture()
    {
        if (_handle)
        {
            ktxTexture_Destroy(handle<ktxTexture>()); _handle = nullptr;
        }
    }